

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O0

void __thiscall
midi_container::trim_tempo_map
          (midi_container *this,unsigned_long p_index,unsigned_long base_timestamp)

{
  size_type sVar1;
  reference this_00;
  size_t sVar2;
  tempo_entry *ptVar3;
  tempo_entry *entry;
  unsigned_long j;
  unsigned_long i;
  tempo_map *map;
  unsigned_long base_timestamp_local;
  unsigned_long p_index_local;
  midi_container *this_local;
  
  sVar1 = std::vector<tempo_map,_std::allocator<tempo_map>_>::size(&this->m_tempo_map);
  if (p_index < sVar1) {
    this_00 = std::vector<tempo_map,_std::allocator<tempo_map>_>::operator[]
                        (&this->m_tempo_map,p_index);
    j = 0;
    sVar2 = tempo_map::get_count(this_00);
    for (; j < sVar2; j = j + 1) {
      ptVar3 = tempo_map::operator[](this_00,j);
      if (ptVar3->m_timestamp < base_timestamp) {
        ptVar3->m_timestamp = 0;
      }
      else {
        ptVar3->m_timestamp = ptVar3->m_timestamp - base_timestamp;
      }
    }
  }
  return;
}

Assistant:

void midi_container::trim_tempo_map( unsigned long p_index, unsigned long base_timestamp )
{
    if ( p_index < m_tempo_map.size() )
    {
        tempo_map & map = m_tempo_map[ p_index ];

        for ( unsigned long i = 0, j = map.get_count(); i < j; ++i )
        {
            tempo_entry & entry = map[ i ];
            if ( entry.m_timestamp >= base_timestamp )
                entry.m_timestamp -= base_timestamp;
            else
                entry.m_timestamp = 0;
        }
    }
}